

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.h
# Opt level: O2

void skipNextN(uint64_t *seed,uint64_t n)

{
  uint64_t m;
  long lVar1;
  long lVar2;
  uint64_t ia;
  long lVar3;
  uint64_t im;
  long lVar4;
  
  lVar3 = 0xb;
  lVar4 = 0x5deece66d;
  lVar1 = 1;
  lVar2 = 0;
  for (; n != 0; n = n >> 1) {
    if ((n & 1) != 0) {
      lVar1 = lVar1 * lVar4;
      lVar2 = lVar2 * lVar4 + lVar3;
    }
    lVar3 = lVar3 * (lVar4 + 1);
    lVar4 = lVar4 * lVar4;
  }
  *seed = lVar1 * *seed + lVar2 & 0xffffffffffff;
  return;
}

Assistant:

static inline void skipNextN(uint64_t *seed, uint64_t n)
{
    uint64_t m = 1;
    uint64_t a = 0;
    uint64_t im = 0x5deece66dULL;
    uint64_t ia = 0xb;
    uint64_t k;

    for (k = n; k; k >>= 1)
    {
        if (k & 1)
        {
            m *= im;
            a = im * a + ia;
        }
        ia = (im + 1) * ia;
        im *= im;
    }

    *seed = *seed * m + a;
    *seed &= 0xffffffffffffULL;
}